

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_player_spells(void)

{
  long lVar1;
  
  wr_u16b((uint16_t)(player->class->magic).total_spells);
  if (L'\0' < (player->class->magic).total_spells) {
    lVar1 = 0;
    do {
      wr_byte(player->spell_flags[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (player->class->magic).total_spells);
  }
  if (L'\0' < (player->class->magic).total_spells) {
    lVar1 = 0;
    do {
      wr_byte(player->spell_order[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (player->class->magic).total_spells);
  }
  return;
}

Assistant:

void wr_player_spells(void)
{
	int i;

	wr_u16b(player->class->magic.total_spells);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_flags[i]);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_order[i]);
}